

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

Statement *
slang::ast::ImmediateAssertionStatement::fromSyntax
          (Compilation *compilation,ImmediateAssertionStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  Expression *args_1;
  StatementContext *pSVar1;
  ImmediateAssertionStatementSyntax *this;
  bool bVar2;
  int iVar3;
  ParenthesizedExpressionSyntax *pPVar4;
  ExpressionSyntax *pEVar5;
  undefined4 extraout_var;
  ActionBlockSyntax *pAVar6;
  undefined4 extraout_var_00;
  SyntaxNode *this_00;
  StatementSyntax *pSVar7;
  undefined4 extraout_var_01;
  bool local_a1;
  SourceRange local_90;
  Compilation *local_80;
  ImmediateAssertionStatement *result;
  DiagCode local_68;
  bool local_63;
  bool local_62;
  bool local_61;
  bool isCover;
  bool isFinal;
  Statement *pSStack_60;
  bool isDeferred;
  Statement *ifFalse;
  Statement *ifTrue;
  socklen_t sStack_48;
  bool bad;
  Expression *local_40;
  Expression *cond;
  StatementContext *pSStack_30;
  AssertionKind assertKind;
  StatementContext *stmtCtx_local;
  ASTContext *context_local;
  ImmediateAssertionStatementSyntax *syntax_local;
  Compilation *compilation_local;
  
  pSStack_30 = stmtCtx;
  stmtCtx_local = (StatementContext *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (ImmediateAssertionStatementSyntax *)compilation;
  cond._4_4_ = SemanticFacts::getAssertKind((syntax->super_StatementSyntax).super_SyntaxNode.kind);
  pPVar4 = not_null<slang::syntax::ParenthesizedExpressionSyntax_*>::operator->
                     ((not_null<slang::syntax::ParenthesizedExpressionSyntax_*> *)
                      &context_local[1].randomizeDetails);
  pEVar5 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&pPVar4->expression);
  pSVar1 = stmtCtx_local;
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffb8,None);
  iVar3 = Expression::bind((int)pEVar5,(sockaddr *)pSVar1,sStack_48);
  local_40 = (Expression *)CONCAT44(extraout_var,iVar3);
  ifTrue._7_1_ = Expression::bad(local_40);
  if ((!(bool)ifTrue._7_1_) &&
     (bVar2 = ASTContext::requireBooleanConvertible((ASTContext *)stmtCtx_local,local_40), !bVar2))
  {
    ifTrue._7_1_ = 1;
  }
  ifFalse = (Statement *)0x0;
  pSStack_60 = (Statement *)0x0;
  pAVar6 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                     ((not_null<slang::syntax::ActionBlockSyntax_*> *)
                      &context_local[1].assertionInstance);
  if (pAVar6->statement != (StatementSyntax *)0x0) {
    pAVar6 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                       ((not_null<slang::syntax::ActionBlockSyntax_*> *)
                        &context_local[1].assertionInstance);
    iVar3 = Statement::bind((int)pAVar6->statement,(sockaddr *)stmtCtx_local,(socklen_t)pSStack_30);
    ifFalse = (Statement *)CONCAT44(extraout_var_00,iVar3);
  }
  pAVar6 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                     ((not_null<slang::syntax::ActionBlockSyntax_*> *)
                      &context_local[1].assertionInstance);
  if (pAVar6->elseClause != (ElseClauseSyntax *)0x0) {
    pAVar6 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                       ((not_null<slang::syntax::ActionBlockSyntax_*> *)
                        &context_local[1].assertionInstance);
    this_00 = not_null<slang::syntax::SyntaxNode_*>::operator->(&pAVar6->elseClause->clause);
    pSVar7 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(this_00);
    iVar3 = Statement::bind((int)pSVar7,(sockaddr *)stmtCtx_local,(socklen_t)pSStack_30);
    pSStack_60 = (Statement *)CONCAT44(extraout_var_01,iVar3);
  }
  local_61 = context_local[1].firstTempVar != (TempVarSymbol *)0x0;
  local_62 = false;
  if (local_61) {
    local_62 = parsing::Token::valid
                         ((Token *)&((context_local[1].firstTempVar)->super_VariableSymbol).
                                    super_ValueSymbol.super_Symbol.indexInScope);
  }
  pSVar1 = stmtCtx_local;
  local_a1 = cond._4_4_ == CoverProperty || cond._4_4_ == CoverSequence;
  local_63 = local_a1;
  if ((cond._4_4_ == CoverProperty || cond._4_4_ == CoverSequence) &&
     (pSStack_60 != (Statement *)0x0)) {
    local_68.subsystem = Statements;
    local_68.code = 0xc;
    pAVar6 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                       ((not_null<slang::syntax::ActionBlockSyntax_*> *)
                        &context_local[1].assertionInstance);
    _result = slang::syntax::SyntaxNode::sourceRange(&pAVar6->elseClause->super_SyntaxNode);
    ASTContext::addDiag((ASTContext *)pSVar1,local_68,_result);
    ifTrue._7_1_ = 1;
  }
  if ((local_61 & 1U) != 0) {
    if (ifFalse != (Statement *)0x0) {
      checkDeferredAssertAction(ifFalse,(ASTContext *)stmtCtx_local);
    }
    if (pSStack_60 != (Statement *)0x0) {
      checkDeferredAssertAction(pSStack_60,(ASTContext *)stmtCtx_local);
    }
  }
  this = syntax_local;
  args_1 = local_40;
  local_90 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
  local_80 = (Compilation *)
             BumpAllocator::
             emplace<slang::ast::ImmediateAssertionStatement,slang::ast::AssertionKind&,slang::ast::Expression_const&,slang::ast::Statement_const*&,slang::ast::Statement_const*&,bool&,bool&,slang::SourceRange>
                       ((BumpAllocator *)this,(AssertionKind *)((long)&cond + 4),args_1,&ifFalse,
                        &stack0xffffffffffffffa0,&local_61,&local_62,&local_90);
  if ((((ifTrue._7_1_ & 1) != 0) ||
      ((ifFalse != (Statement *)0x0 && (bVar2 = Statement::bad(ifFalse), bVar2)))) ||
     ((pSStack_60 != (Statement *)0x0 && (bVar2 = Statement::bad(pSStack_60), bVar2)))) {
    compilation_local =
         (Compilation *)Statement::badStmt((Compilation *)syntax_local,(Statement *)local_80);
  }
  else {
    compilation_local = local_80;
  }
  return (Statement *)compilation_local;
}

Assistant:

Statement& ImmediateAssertionStatement::fromSyntax(Compilation& compilation,
                                                   const ImmediateAssertionStatementSyntax& syntax,
                                                   const ASTContext& context,
                                                   StatementContext& stmtCtx) {
    AssertionKind assertKind = SemanticFacts::getAssertKind(syntax.kind);
    auto& cond = Expression::bind(*syntax.expr->expression, context);
    bool bad = cond.bad();

    if (!bad && !context.requireBooleanConvertible(cond))
        bad = true;

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    bool isDeferred = syntax.delay != nullptr;
    bool isFinal = false;
    if (isDeferred)
        isFinal = syntax.delay->finalKeyword.valid();

    bool isCover = assertKind == AssertionKind::CoverProperty ||
                   assertKind == AssertionKind::CoverSequence;
    if (isCover && ifFalse) {
        context.addDiag(diag::CoverStmtNoFail, syntax.action->elseClause->sourceRange());
        bad = true;
    }

    if (isDeferred) {
        if (ifTrue)
            checkDeferredAssertAction(*ifTrue, context);
        if (ifFalse)
            checkDeferredAssertAction(*ifFalse, context);
    }

    auto result = compilation.emplace<ImmediateAssertionStatement>(assertKind, cond, ifTrue,
                                                                   ifFalse, isDeferred, isFinal,
                                                                   syntax.sourceRange());
    if (bad || (ifTrue && ifTrue->bad()) || (ifFalse && ifFalse->bad()))
        return badStmt(compilation, result);

    return *result;
}